

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

void ats1h_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  _Bool _Var1;
  uint64_t uVar2;
  long lVar3;
  
  uVar2 = do_ats_write(env,value,ri->opc2 & MMU_DATA_STORE,ARMMMUIdx_E2);
  _Var1 = arm_is_secure(env);
  if ((!_Var1) || (lVar3 = 0x460, (env->features & 0x10000000) != 0)) {
    lVar3 = 0x450;
  }
  *(uint64_t *)((long)env->regs + lVar3) = uVar2;
  return;
}

Assistant:

static void ats1h_write(CPUARMState *env, const ARMCPRegInfo *ri,
                        uint64_t value)
{
    MMUAccessType access_type = ri->opc2 & 1 ? MMU_DATA_STORE : MMU_DATA_LOAD;
    uint64_t par64;

    par64 = do_ats_write(env, value, access_type, ARMMMUIdx_E2);

    A32_BANKED_CURRENT_REG_SET(env, par, par64);
}